

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O1

Handle __thiscall soul::Value::getUnsizedArrayContent(Value *this)

{
  PackedData local_20;
  
  getData(&local_20,this);
  if (local_20.size == 8) {
    return *(Handle *)local_20.data;
  }
  throwInternalCompilerError("size == sizeof (Primitive)","getAs",0x15e);
}

Assistant:

ConstantTable::Handle Value::getUnsizedArrayContent() const { return getData().getAs<ConstantTable::Handle>(); }